

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::addVars(Highs *this,HighsInt num_new_var,double *lower,double *upper)

{
  HighsStatus HVar1;
  int in_ESI;
  HighsInt in_stack_0000003c;
  double *in_stack_00000040;
  vector<double,_std::allocator<double>_> cost;
  Highs *in_stack_00000060;
  HighsStatus return_status;
  HighsInt *in_stack_00000088;
  double *in_stack_00000090;
  size_type in_stack_ffffffffffffff78;
  Highs *in_stack_ffffffffffffff80;
  HighsStatus in_stack_ffffffffffffffcc;
  Highs *in_stack_ffffffffffffffd0;
  
  logHeader(in_stack_ffffffffffffff80);
  if (in_ESI < 1) {
    returnFromHighs(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49231b);
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,(value_type_conflict1 *)0x492338);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x49234c);
  HVar1 = addCols(in_stack_00000060,
                  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,
                  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,in_stack_00000040,in_stack_0000003c,
                  (HighsInt *)this,in_stack_00000088,in_stack_00000090);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(HVar1,in_ESI));
  return HVar1;
}

Assistant:

HighsStatus Highs::addVars(const HighsInt num_new_var, const double* lower,
                           const double* upper) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  // Avoid touching entry [0] of a vector of size 0
  if (num_new_var <= 0) returnFromHighs(return_status);
  std::vector<double> cost;
  cost.assign(num_new_var, 0);
  return addCols(num_new_var, cost.data(), lower, upper, 0, nullptr, nullptr,
                 nullptr);
}